

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O3

Result __thiscall Kernel::KBO::State::result(State *this,KBO *kbo,AppliedTerm t1,AppliedTerm t2)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  int iVar4;
  Result RVar5;
  
  if (this->_weightDiff == 0) {
    if (*(uint *)(t1.term._content + 8) == *(uint *)(t2.term._content + 8)) {
      RVar2 = this->_lexResult;
      goto LAB_0053ec9f;
    }
    if ((*(byte *)(t1.term._content + 0x28) & 0x10) == 0) {
      RVar2 = PrecedenceOrdering::comparePrecedences
                        (&kbo->super_PrecedenceOrdering,(Term *)t1.term._content,
                         (Term *)t2.term._content);
      goto LAB_0053ec9f;
    }
    iVar3 = PrecedenceOrdering::predicatePrecedence
                      (&kbo->super_PrecedenceOrdering,*(uint *)(t1.term._content + 8));
    iVar4 = PrecedenceOrdering::predicatePrecedence
                      (&kbo->super_PrecedenceOrdering,*(uint *)(t2.term._content + 8));
    bVar1 = iVar3 <= iVar4;
  }
  else {
    bVar1 = this->_weightDiff < 1;
  }
  RVar2 = bVar1 + GREATER;
LAB_0053ec9f:
  if (((((RVar2 & ~GREATER) != LESS) || (RVar5 = INCOMPARABLE, this->_posNum < 1)) &&
      (RVar5 = RVar2, 0 < this->_negNum)) && (RVar5 = INCOMPARABLE, (RVar2 & ~LESS) != GREATER)) {
    RVar5 = RVar2;
  }
  return RVar5;
}

Assistant:

Ordering::Result KBO::State::result(KBO const& kbo, AppliedTerm t1, AppliedTerm t2)
{
  Result res;
  if(_weightDiff) {
    res=_weightDiff>0 ? GREATER : LESS;
  } else if(t1.term.term()->functor()!=t2.term.term()->functor()) {
    if(t1.term.term()->isLiteral()) {
      ASS(t2.term.term()->isLiteral());
      int prec1, prec2;
      prec1=kbo.predicatePrecedence(t1.term.term()->functor());
      prec2=kbo.predicatePrecedence(t2.term.term()->functor());
      ASS_NEQ(prec1,prec2);//precedence ordering must be total
      res=(prec1>prec2)?GREATER:LESS;
    } else {
      ASS(!t2.term.term()->isLiteral());
      res=kbo.comparePrecedences(t1.term.term(), t2.term.term());
      ASS_REP(res==GREATER || res==LESS, res); //precedence ordering must be total
    }
  } else {
    res=_lexResult;
  }
  res=applyVariableCondition(res);
  return res;
}